

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CanAnalyzerResults.cpp
# Opt level: O2

void __thiscall
CanAnalyzerResults::DisplayStringFromData
          (CanAnalyzerResults *this,U64 frame,DisplayBase display_base,char *output,
          U32 result_string_max_length)

{
  ostream *poVar1;
  ulong uVar2;
  ulong uVar3;
  char *local_258 [4];
  char tmp [128];
  stringstream ss;
  ostream local_1a8 [8];
  string local_1a0 [368];
  
  uVar2 = frame >> 0x10 & 0xff;
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  uVar3 = 9;
  if (uVar2 < 9) {
    uVar3 = uVar2;
  }
  std::__cxx11::string::string((string *)tmp,"",(allocator *)local_258);
  std::__cxx11::stringbuf::str(local_1a0);
  std::__cxx11::string::~string((string *)tmp);
  poVar1 = std::operator<<(local_1a8,"Dev: ");
  poVar1 = std::operator<<(poVar1,DeviceTypeLookup[(uint)(frame >> 0x18) & 0x1f]);
  poVar1 = std::operator<<(poVar1," M: ");
  std::operator<<(poVar1,ManufacturerLookup[uVar3]);
  AnalyzerHelpers::GetNumberString((ulong)((uint)(frame >> 10) & 0x3f),display_base,6,tmp,0x80);
  poVar1 = std::operator<<(local_1a8," Class: ");
  std::operator<<(poVar1,tmp);
  AnalyzerHelpers::GetNumberString((ulong)((uint)(frame >> 6) & 0xf),display_base,4,tmp,0x80);
  poVar1 = std::operator<<(local_1a8," Idx: ");
  std::operator<<(poVar1,tmp);
  AnalyzerHelpers::GetNumberString((ulong)((uint)frame & 0x3f),display_base,6,tmp,0x80);
  poVar1 = std::operator<<(local_1a8," ID: ");
  std::operator<<(poVar1,tmp);
  std::__cxx11::stringbuf::str();
  strncpy(output,local_258[0],(ulong)(result_string_max_length - 1));
  std::__cxx11::string::~string((string *)local_258);
  output[result_string_max_length - 1] = '\0';
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return;
}

Assistant:

void CanAnalyzerResults::DisplayStringFromData(U64 frame, DisplayBase display_base, char* output, U32 result_string_max_length)
{
    U64 DeviceType = (frame & DEVICE_TYPE_MASK) >> DEVICE_TYPE_SHIFT;
    U64 Manufacturer = (frame & MANUFACTURER_MASK) >> MANUFACTURER_SHIFT;
    U64 APIClass = (frame & API_CLASS_MASK) >> API_CLASS_SHIFT;
    U64 APIIndex = (frame & API_INDEX_MASK) >> API_INDEX_SHIFT;
    U64 CANID = (frame & CANID_MASK) >> CANID_SHIFT;

    std::stringstream ss;

    if (DeviceType > NUM_DEVICE_TYPE)
        DeviceType = NUM_DEVICE_TYPE;
    if (Manufacturer > NUM_MANUFACTURER)
        Manufacturer = NUM_MANUFACTURER;

    ss.str("");
    ss << "Dev: " << DeviceTypeLookup[DeviceType] << " M: " << ManufacturerLookup[Manufacturer];

    U32 numChars = 128;

    char tmp[128];
    AnalyzerHelpers::GetNumberString(APIClass, display_base, API_CLASS_BITS, tmp, numChars);
    ss << " Class: " << tmp;
    AnalyzerHelpers::GetNumberString(APIIndex, display_base, API_INDEX_BITS, tmp, numChars);
    ss << " Idx: " << tmp;
    AnalyzerHelpers::GetNumberString(CANID, display_base, CANID_BITS, tmp, numChars);
    ss << " ID: " << tmp;

    strncpy(output, ss.str().c_str(), result_string_max_length-1);
    output[result_string_max_length - 1] = '\0';
}